

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O2

void Message<int,int&>(MsgType type,char *pcsz_,int *args,int *args_1)

{
  iterator iVar1;
  LogHelper *pLVar2;
  exception *this;
  char local_31;
  string msg;
  
  util::fmt_abi_cxx11_(&msg,pcsz_,(ulong)(uint)*args,(ulong)(uint)*args_1);
  if (type == msgStatus) {
    pLVar2 = util::operator<<((LogHelper *)&util::cout,statusbegin);
    pLVar2 = util::operator<<(pLVar2,(char (*) [2])0x1a9cd3);
    pLVar2 = util::operator<<(pLVar2,&msg);
    util::operator<<(pLVar2,statusend);
  }
  else {
    if (type == msgError) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<std::__cxx11::string&>(this,&msg);
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&seen_messages_abi_cxx11_._M_t,&msg);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &seen_messages_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&seen_messages_abi_cxx11_,&msg);
      if (type == msgWarning) {
        pLVar2 = util::operator<<((LogHelper *)&util::cout,YELLOW);
        util::operator<<(pLVar2,(char (*) [10])"Warning: ");
      }
      else if (type == msgFix) {
        pLVar2 = util::operator<<((LogHelper *)&util::cout,GREEN);
        util::operator<<(pLVar2,(char (*) [8])"Fixed: ");
      }
      else if (type == msgInfo) {
        util::operator<<((LogHelper *)&util::cout,(char (*) [7])"Info: ");
      }
      pLVar2 = util::operator<<((LogHelper *)&util::cout,&msg);
      pLVar2 = util::operator<<(pLVar2,none);
      local_31 = '\n';
      util::operator<<(pLVar2,&local_31);
    }
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void Message(MsgType type, const char* pcsz_, Args&& ...args)
{
    std::string msg = util::fmt(pcsz_, std::forward<Args>(args)...);

    if (type == msgError)
        throw util::exception(msg);

    if (type != msgStatus)
    {
        if (seen_messages.find(msg) != seen_messages.end())
            return;

        seen_messages.insert(msg);
    }

    switch (type)
    {
    case msgStatus:  break;
    case msgInfo:    util::cout << "Info: "; break;
    case msgFix:     util::cout << colour::GREEN << "Fixed: "; break;
    case msgWarning: util::cout << colour::YELLOW << "Warning: "; break;
    case msgError:   util::cout << colour::RED << "Error: "; break;
    }

    if (type == msgStatus)
        util::cout << ttycmd::statusbegin << "\r" << msg << ttycmd::statusend;
    else
        util::cout << msg << colour::none << '\n';
}